

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void write_deleted_particles(bool write_p,bool write_ph)

{
  int iVar1;
  double *pdVar2;
  bool bVar3;
  double dVar4;
  unique_ptr<spatial_region,_std::default_delete<spatial_region>_> uVar5;
  _Ios_Openmode _Var6;
  uint uVar7;
  void *pvVar8;
  long *plVar9;
  ostream *poVar10;
  ulong uVar11;
  ulong uVar12;
  int m_1;
  long lVar13;
  long *this;
  long *plVar14;
  void *pvVar15;
  long lVar16;
  double *pdVar17;
  int i;
  int m;
  double dVar18;
  string file_name;
  string file_name_suffix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_668;
  char s_cmr [20];
  ofstream fout_deleted_e;
  ofstream fout_deleted_p;
  ofstream fout_deleted_ph;
  
  file_name._M_dataplus._M_p = (pointer)&file_name.field_2;
  _Var6 = (_S_out|_S_app) - (uint)(mpi_rank == 0);
  file_name._M_string_length = 0;
  file_name.field_2._M_local_buf[0] = '\0';
  OutputIterations::get_current_iteration_string_abi_cxx11_(&file_name_suffix,&output_iterations);
  iVar1 = neps_ph;
  uVar11 = (long)neps_ph * 8;
  if ((long)neps_ph < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar11);
  for (uVar11 = 0; (uint)(~(iVar1 >> 0x1f) & iVar1) != uVar11; uVar11 = uVar11 + 1) {
    *(undefined8 *)((long)pvVar8 + uVar11 * 8) = 0;
  }
  uVar11 = 0;
  do {
    if ((long)n_sr <= (long)uVar11) {
      if (write_ph) {
        pvVar15 = pvVar8;
        if (mpi_rank == 0) {
          pvVar15 = (void *)0x1;
        }
        MPI_Reduce(pvVar15,pvVar8,neps_ph,&ompi_mpi_double,&ompi_mpi_op_sum,0,&ompi_mpi_comm_world);
        if (mpi_rank == 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &fout_deleted_p,&data_folder_abi_cxx11_,"/spectrum_deleted_ph");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &fout_deleted_e,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &fout_deleted_p,&file_name_suffix);
          std::__cxx11::string::operator=((string *)&file_name,(string *)&fout_deleted_e);
          std::__cxx11::string::~string((string *)&fout_deleted_e);
          std::__cxx11::string::~string((string *)&fout_deleted_p);
          std::ofstream::ofstream(&fout_deleted_e,file_name._M_dataplus._M_p,_S_out);
          dVar18 = ((lambda * 11148500000000.0 * dx * dy * dz) / 248.05021344239853) / deps_ph;
          for (lVar13 = 0; lVar13 < neps_ph; lVar13 = lVar13 + 1) {
            dVar4 = dVar18 * *(double *)((long)pvVar8 + lVar13 * 8);
            *(double *)((long)pvVar8 + lVar13 * 8) = dVar4;
            poVar10 = std::ostream::_M_insert<double>(dVar4);
            std::operator<<(poVar10,'\n');
          }
          std::ofstream::close();
          std::ofstream::~ofstream(&fout_deleted_e);
        }
      }
      operator_delete__(pvVar8);
      std::__cxx11::string::~string((string *)&file_name_suffix);
      std::__cxx11::string::~string((string *)&file_name);
      return;
    }
    if (uVar11 == (uint)mpi_rank) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout_deleted_p,&data_folder_abi_cxx11_,"/deleted");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout_deleted_e,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout_deleted_p,&file_name_suffix);
      std::__cxx11::string::operator=((string *)&file_name,(string *)&fout_deleted_e);
      std::__cxx11::string::~string((string *)&fout_deleted_e);
      std::__cxx11::string::~string((string *)&fout_deleted_p);
      std::ofstream::ofstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fout_deleted_e,file_name._M_dataplus._M_p,_Var6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout_deleted_ph,&data_folder_abi_cxx11_,"/deleted_p");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout_deleted_p,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout_deleted_ph,&file_name_suffix);
      std::__cxx11::string::operator=((string *)&file_name,(string *)&fout_deleted_p);
      std::__cxx11::string::~string((string *)&fout_deleted_p);
      std::__cxx11::string::~string((string *)&fout_deleted_ph);
      std::ofstream::ofstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fout_deleted_p,file_name._M_dataplus._M_p,_Var6);
      std::operator+(&local_668,&data_folder_abi_cxx11_,"/deleted_ph");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout_deleted_ph,&local_668,&file_name_suffix);
      std::__cxx11::string::operator=((string *)&file_name,(string *)&fout_deleted_ph);
      std::__cxx11::string::~string((string *)&fout_deleted_ph);
      std::__cxx11::string::~string((string *)&local_668);
      std::ofstream::ofstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &fout_deleted_ph,file_name._M_dataplus._M_p,_Var6);
      iVar1 = n_ion_populations;
      lVar13 = (long)n_ion_populations;
      uVar12 = lVar13 * 0x200 + 8;
      if (lVar13 < 0) {
        uVar12 = 0xffffffffffffffff;
      }
      plVar9 = (long *)operator_new__(uVar12);
      plVar14 = plVar9 + 1;
      *plVar9 = lVar13;
      if (iVar1 != 0) {
        lVar16 = 0;
        this = plVar14;
        do {
          std::ofstream::ofstream(this);
          lVar16 = lVar16 + -0x200;
          this = this + 0x40;
        } while (-lVar16 != lVar13 * 0x200);
      }
      for (lVar13 = 0;
          uVar5._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
          _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
          super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl =
               psr._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
               _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
               super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,
          lVar13 < n_ion_populations; lVar13 = lVar13 + 1) {
        sprintf(s_cmr,"%g",icmr[lVar13]);
        std::operator+(&local_668,&data_folder_abi_cxx11_,"/deleted_");
        std::__cxx11::string::operator=((string *)&file_name,(string *)&local_668);
        std::__cxx11::string::~string((string *)&local_668);
        std::__cxx11::string::append((char *)&file_name);
        std::__cxx11::string::append((char *)&file_name);
        std::__cxx11::string::append((string *)&file_name);
        std::ofstream::open((char *)plVar14,(_Ios_Openmode)file_name._M_dataplus._M_p);
        plVar14 = plVar14 + 0x40;
      }
      for (pdVar17 = *(double **)
                      ((long)psr._M_t.
                             super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>
                             .super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x248);
          pdVar17 !=
          *(double **)
           ((long)uVar5._M_t.
                  super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                  super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                  super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x250);
          pdVar17 = pdVar17 + 10) {
        dVar18 = *pdVar17;
        if ((dVar18 != -1.0) || (NAN(dVar18))) {
          if (dVar18 == 1.0 && write_p) {
            iVar1 = i_particle_p + 1;
            bVar3 = enthp_p <= i_particle_p;
            i_particle_p = iVar1;
            if (bVar3) {
              i_particle_ph = 0;
              poVar10 = std::ostream::_M_insert<double>(pdVar17[1]);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>
                                  ((((double)x0_sr.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start[uVar11] +
                                    pdVar17[2]) * dx) / 6.283185307179586);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>((dy * pdVar17[3]) / 6.283185307179586);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>((dz * pdVar17[4]) / 6.283185307179586);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>(pdVar17[5]);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>(pdVar17[6]);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>(pdVar17[7]);
              std::endl<char,std::char_traits<char>>(poVar10);
              goto LAB_00112ee5;
            }
          }
          else if (write_ph && dVar18 == 0.0) {
            uVar7 = (uint)((pdVar17[8] * 0.511) / deps_ph);
            if ((-1 < (int)uVar7) && ((int)uVar7 < neps_ph)) {
              *(double *)((long)pvVar8 + (ulong)uVar7 * 8) =
                   *(double *)((long)pvVar8 + (ulong)uVar7 * 8) + pdVar17[1];
            }
            bVar3 = enthp_ph <= i_particle_ph;
            i_particle_ph = i_particle_ph + 1;
            if (bVar3) {
              i_particle_ph = 0;
              poVar10 = std::ostream::_M_insert<double>(pdVar17[1]);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>
                                  ((((double)x0_sr.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start[uVar11] +
                                    pdVar17[2]) * dx) / 6.283185307179586);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>((dy * pdVar17[3]) / 6.283185307179586);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>((dz * pdVar17[4]) / 6.283185307179586);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>(pdVar17[5]);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>(pdVar17[6]);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>(pdVar17[7]);
              std::endl<char,std::char_traits<char>>(poVar10);
              goto LAB_00112ee5;
            }
          }
          else {
            uVar12 = 0;
            do {
              if ((uint)(~(n_ion_populations >> 0x1f) & n_ion_populations) == uVar12)
              goto LAB_00112f0d;
              pdVar2 = icmr + uVar12;
              uVar12 = uVar12 + 1;
            } while ((dVar18 != *pdVar2) || (NAN(dVar18) || NAN(*pdVar2)));
            bVar3 = enthp_i <= i_particle_i;
            i_particle_i = i_particle_i + 1;
            if (bVar3) {
              i_particle_i = 0;
              poVar10 = std::ostream::_M_insert<double>(pdVar17[1]);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>
                                  ((((double)x0_sr.super__Vector_base<int,_std::allocator<int>_>.
                                             _M_impl.super__Vector_impl_data._M_start[uVar11] +
                                    pdVar17[2]) * dx) / 6.283185307179586);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>((dy * pdVar17[3]) / 6.283185307179586);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>((dz * pdVar17[4]) / 6.283185307179586);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>(pdVar17[5]);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>(pdVar17[6]);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>(pdVar17[7]);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>(pdVar17[8]);
              std::endl<char,std::char_traits<char>>(poVar10);
              poVar10 = std::ostream::_M_insert<double>(pdVar17[9]);
              std::endl<char,std::char_traits<char>>(poVar10);
            }
          }
        }
        else {
          bVar3 = enthp <= i_particle;
          i_particle = i_particle + 1;
          if (bVar3) {
            i_particle = 0;
            poVar10 = std::ostream::_M_insert<double>(pdVar17[1]);
            std::endl<char,std::char_traits<char>>(poVar10);
            poVar10 = std::ostream::_M_insert<double>
                                ((((double)x0_sr.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar11] +
                                  pdVar17[2]) * dx) / 6.283185307179586);
            std::endl<char,std::char_traits<char>>(poVar10);
            poVar10 = std::ostream::_M_insert<double>((dy * pdVar17[3]) / 6.283185307179586);
            std::endl<char,std::char_traits<char>>(poVar10);
            poVar10 = std::ostream::_M_insert<double>((dz * pdVar17[4]) / 6.283185307179586);
            std::endl<char,std::char_traits<char>>(poVar10);
            poVar10 = std::ostream::_M_insert<double>(pdVar17[5]);
            std::endl<char,std::char_traits<char>>(poVar10);
            poVar10 = std::ostream::_M_insert<double>(pdVar17[6]);
            std::endl<char,std::char_traits<char>>(poVar10);
            poVar10 = std::ostream::_M_insert<double>(pdVar17[7]);
            std::endl<char,std::char_traits<char>>(poVar10);
LAB_00112ee5:
            poVar10 = std::ostream::_M_insert<double>(pdVar17[8]);
            std::endl<char,std::char_traits<char>>(poVar10);
            poVar10 = std::ostream::_M_insert<double>(pdVar17[9]);
            std::endl<char,std::char_traits<char>>(poVar10);
          }
        }
LAB_00112f0d:
      }
      if (pdVar17 !=
          *(double **)
           ((long)uVar5._M_t.
                  super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                  super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                  super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x248)) {
        *(double **)
         ((long)uVar5._M_t.
                super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>._M_t.
                super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x250) =
             *(double **)
              ((long)uVar5._M_t.
                     super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
                     super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl + 0x248);
      }
      std::ofstream::close();
      std::ofstream::close();
      std::ofstream::close();
      for (lVar13 = 0; lVar13 < n_ion_populations; lVar13 = lVar13 + 1) {
        std::ofstream::close();
      }
      if (*plVar9 != 0) {
        lVar13 = *plVar9 << 9;
        do {
          std::ofstream::~ofstream((void *)((long)plVar9 + lVar13 + -0x1f8));
          lVar13 = lVar13 + -0x200;
        } while (lVar13 != 0);
      }
      operator_delete__(plVar9);
      std::ofstream::~ofstream(&fout_deleted_ph);
      std::ofstream::~ofstream(&fout_deleted_p);
      std::ofstream::~ofstream(&fout_deleted_e);
    }
    MPI_Barrier(&ompi_mpi_comm_world);
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

void write_deleted_particles(bool write_p, bool write_ph)
{
    ios_base::openmode non_binary_mode;
    if (mpi_rank == 0) {
        non_binary_mode = ios_base::out;
    } else {
        non_binary_mode = ios_base::out | ios_base::app;
    }

    std::string file_name;
    std::string file_name_suffix = output_iterations.get_current_iteration_string();
    
    double* spectrum_ph = new double[neps_ph];
    for(int i=0; i<neps_ph; i++) spectrum_ph[i] = 0;
    int i_eps = 0;

    for(int n=0; n<n_sr; n++)
    {
        if (mpi_rank == n) {
            file_name = data_folder + "/deleted" + file_name_suffix;
            ofstream fout_deleted_e(file_name.c_str(), non_binary_mode);

            file_name = data_folder + "/deleted_p" + file_name_suffix;
            ofstream fout_deleted_p(file_name.c_str(), non_binary_mode);

            file_name = data_folder + "/deleted_ph" + file_name_suffix;
            ofstream fout_deleted_ph(file_name.c_str(), non_binary_mode);

            ofstream* fout_deleted_i = new ofstream[n_ion_populations];
            for (int m=0; m<n_ion_populations; ++m)
            {
                char s_cmr[20];
                sprintf(s_cmr,"%g",icmr[m]);
                file_name = data_folder+"/deleted_";
                file_name += s_cmr;
                file_name += "_";
                file_name += file_name_suffix;
                fout_deleted_i[m].open(file_name.c_str(), non_binary_mode);
            }

            vector<spatial_region::deleted_particle>& del_particles = psr->deleted_particles;

            for (auto it = del_particles.begin(); it != del_particles.end(); ++it)
            {
                if ((*it).cmr == -1)
                {
                    i_particle++;
                    if(i_particle > enthp)
                    {
                        i_particle = 0;
                        fout_deleted_e << (*it).q << endl;
                        fout_deleted_e << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                        fout_deleted_e << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                        fout_deleted_e << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                        #ifdef QUILL_NOQED
                        fout_deleted_e << (*it).g << endl << 0.0 << endl;
                        #else
                        fout_deleted_e << (*it).g << endl << (*it).chi << endl;
                        #endif
                    }
                }
                else if (write_p && (*it).cmr == 1)
                {
                    i_particle_p++;
                    if(i_particle_p > enthp_p)
                    {
                        i_particle_ph = 0;
                        fout_deleted_p << (*it).q << endl;
                        fout_deleted_p << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                        fout_deleted_p << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                        fout_deleted_p << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                        #ifdef QUILL_NOQED
                        fout_deleted_p << (*it).g << endl << 0.0 << endl;
                        #else
                        fout_deleted_p << (*it).g << endl << (*it).chi << endl;
                        #endif
                    }
                }
                else if (write_ph && (*it).cmr == 0)
                {
                    i_eps = (*it).g*0.511/deps_ph;
                    if((i_eps > -1) && (i_eps < neps_ph)) {
                        spectrum_ph[i_eps] = spectrum_ph[i_eps] + (*it).q; // q>0 for photons
                    }
                    i_particle_ph++;
                    if(i_particle_ph > enthp_ph)
                    {
                        i_particle_ph = 0;
                        fout_deleted_ph << (*it).q << endl;
                        fout_deleted_ph << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                        fout_deleted_ph << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                        fout_deleted_ph << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                        #ifdef QUILL_NOQED
                        fout_deleted_ph << (*it).g << endl << 0.0 << endl;
                        #else
                        fout_deleted_ph << (*it).g << endl << (*it).chi << endl;
                        #endif
                    }
                }
                else
                {
                    for (int j=0; j<n_ion_populations; ++j)
                    {
                        if ((*it).cmr == icmr[j])
                        {
                            i_particle_i++;
                            if(i_particle_i > enthp_i)
                            {
                                i_particle_i = 0;
                                fout_deleted_i[j] << (*it).q << endl;
                                fout_deleted_i[j] << dx*((*it).x + x0_sr[n])/(2*PI) << endl;
                                fout_deleted_i[j] << dy*((*it).y)/(2*PI) << endl << dz*((*it).z)/(2*PI) << endl;
                                fout_deleted_i[j] << (*it).ux << endl << (*it).uy << endl <<(*it).uz << endl;
                                #ifdef QUILL_NOQED
                                fout_deleted_i[j] << (*it).g << endl << 0.0 << endl;
                                #else
                                fout_deleted_i[j] << (*it).g << endl << (*it).chi << endl;
                                #endif
                            }
                            break;
                        }
                    }
                }
            }
            del_particles.clear();
            fout_deleted_e.close();
            fout_deleted_p.close();
            fout_deleted_ph.close();
            for (int m=0; m<n_ion_populations; ++m)
            {
                fout_deleted_i[m].close();
            }
            delete[] fout_deleted_i;
        }
        MPI_Barrier(MPI_COMM_WORLD);
    }

    if (write_ph) {
        //gathering photon spectra on process rank 0
        if (mpi_rank == 0) {
            MPI_Reduce(MPI_IN_PLACE, spectrum_ph, neps_ph, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
        } else {
            MPI_Reduce(spectrum_ph, spectrum_ph, neps_ph, MPI_DOUBLE, MPI_SUM, 0, MPI_COMM_WORLD);
        }

        //spectrum output
        if (mpi_rank == 0) {
            file_name = data_folder + "/spectrum_deleted_ph" + file_name_suffix;
            ofstream fout_spectrum_ph(file_name.c_str());

            double spectrum_norm_ph = 1.11485e13 * lambda*dx*dy*dz/(8*PI*PI*PI)/deps_ph;
            for(int i=0; i<neps_ph; i++)
            {
                spectrum_ph[i] = spectrum_ph[i] * spectrum_norm_ph;
                fout_spectrum_ph << spectrum_ph[i] << '\n';
            }

            fout_spectrum_ph.close();
        }
    }

    delete[] spectrum_ph;
}